

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# myserver.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *msgdir;
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  ssize_t sVar7;
  SendMessage *pSVar8;
  void *pvVar9;
  ostream *poVar10;
  undefined1 local_638 [40];
  char message_2 [12];
  undefined1 local_5c8 [32];
  undefined1 local_5a8 [64];
  undefined1 local_568 [40];
  string local_540 [36];
  int local_51c;
  undefined1 local_518 [8];
  string confirmation;
  undefined8 local_4f8;
  char message_1 [12];
  char cStack_4e4;
  char cStack_4e3;
  char cStack_4e2;
  char cStack_4e1;
  char message [12];
  string commandResult;
  undefined1 local_4b0 [3];
  bool commandMatched;
  in_addr local_4ac;
  sockaddr_in cliaddress;
  sockaddr_in address;
  long size;
  char buffer [1024];
  socklen_t local_80;
  int local_7c;
  socklen_t addrlen;
  int new_socket;
  int create_socket;
  allocator local_61;
  string local_60 [32];
  SendMessage *local_40;
  ServerOperation *command;
  int PORT;
  char EXECUTEPENDING [4];
  char FAILURE [5];
  char SUCCESS [4];
  char USERDIR [6];
  char *MESSAGEDIR;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  builtin_strncpy(FAILURE + 1,"user",4);
  stack0xffffffffffffffd6 = 0xa4b4f;
  stack0xffffffffffffffd1 = 0xa525245;
  EXECUTEPENDING[0] = '\0';
  stack0xffffffffffffffcd = 0xa5045;
  if (argc == 3) {
    command._0_4_ = atoi(argv[1]);
    msgdir = argv[2];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,FAILURE + 1,&local_61);
    createWorkingDirectories(msgdir,(string *)local_60);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    addrlen = socket(2,1,0);
    memset(cliaddress.sin_zero,0,0x10);
    cliaddress.sin_zero[0] = '\x02';
    cliaddress.sin_zero[1] = '\0';
    cliaddress.sin_zero[4] = '\0';
    cliaddress.sin_zero[5] = '\0';
    cliaddress.sin_zero[6] = '\0';
    cliaddress.sin_zero[7] = '\0';
    cliaddress.sin_zero._2_2_ = htons((uint16_t)(int)command);
    iVar3 = bind(addrlen,(sockaddr *)cliaddress.sin_zero,0x10);
    if (iVar3 == 0) {
      listen(addrlen,5);
      local_80 = 0x10;
      do {
        printf("Waiting for connections...\n");
        local_7c = accept(addrlen,(sockaddr *)local_4b0,&local_80);
        if (0 < local_7c) {
          pcVar5 = inet_ntoa(local_4ac);
          uVar2 = ntohs(stack0xfffffffffffffb52);
          printf("Client connected from %s:%d...\n",pcVar5,(ulong)uVar2);
          strcpy((char *)&size,"Welcome to myserver, Please enter your command:\n");
          iVar3 = local_7c;
          sVar6 = strlen((char *)&size);
          send(iVar3,&size,sVar6,0);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)(message + 8),"",(allocator *)(message + 7));
        std::allocator<char>::~allocator((allocator<char> *)(message + 7));
        do {
          sVar7 = recv(local_7c,&size,0x3ff,0);
          if (sVar7 < 1) {
            if (sVar7 != 0) {
              perror("recv error");
              argv_local._4_4_ = 1;
              local_51c = 1;
              goto LAB_001042ec;
            }
            printf("Client closed remote socket\n");
            break;
          }
          buffer[sVar7 + -8] = '\0';
          printf("Message received: %s",&size);
          bVar1 = true;
          iVar3 = strncasecmp((char *)&size,"send",4);
          if (iVar3 == 0) {
            pSVar8 = (SendMessage *)operator_new(0xd0);
            SendMessage::SendMessage(pSVar8,msgdir);
            local_40 = pSVar8;
          }
          else {
            iVar3 = strncasecmp((char *)&size,"list",4);
            if (iVar3 == 0) {
              pSVar8 = (SendMessage *)operator_new(0x68);
              ListMessage::ListMessage((ListMessage *)pSVar8,msgdir);
              local_40 = pSVar8;
            }
            else {
              iVar3 = strncasecmp((char *)&size,"read",4);
              if (iVar3 == 0) {
                pSVar8 = (SendMessage *)operator_new(0x70);
                ReadMessage::ReadMessage((ReadMessage *)pSVar8,msgdir);
                local_40 = pSVar8;
              }
              else {
                iVar3 = strncasecmp((char *)&size,"del",3);
                if (iVar3 == 0) {
                  pSVar8 = (SendMessage *)operator_new(0x70);
                  DeleteMessage::DeleteMessage((DeleteMessage *)pSVar8,msgdir);
                  local_40 = pSVar8;
                }
                else {
                  iVar3 = strncasecmp((char *)&size,"quit",4);
                  if (iVar3 == 0) {
                    builtin_strncpy(message_1 + 8,"plac",4);
                    cStack_4e4 = 'e';
                    cStack_4e3 = 'h';
                    cStack_4e2 = 'o';
                    cStack_4e1 = 'l';
                    builtin_strncpy(message,"der",4);
                    send(local_7c,EXECUTEPENDING + 1,3,0);
                    iVar3 = local_7c;
                    sVar6 = strlen(message_1 + 8);
                    recv(iVar3,message_1 + 8,sVar6 - 1,0);
                    std::__cxx11::string::operator=((string *)(message + 8),"quit\n");
                    iVar3 = local_7c;
                    pvVar9 = (void *)std::__cxx11::string::c_str();
                    sVar6 = std::__cxx11::string::length();
                    send(iVar3,pvVar9,sVar6,0);
                    break;
                  }
                  local_4f8 = 0x6c6f686563616c70;
                  builtin_strncpy(message_1,"der",4);
                  send(local_7c,(void *)((long)&PORT + 1),4,0);
                  iVar3 = local_7c;
                  sVar6 = strlen((char *)&stack0xfffffffffffffb08);
                  recv(iVar3,&stack0xfffffffffffffb08,sVar6 - 1,0);
                  bVar1 = false;
                  std::__cxx11::string::operator=
                            ((string *)(message + 8),"No matching command found.\n");
                  iVar3 = local_7c;
                  pvVar9 = (void *)std::__cxx11::string::c_str();
                  sVar6 = std::__cxx11::string::length();
                  send(iVar3,pvVar9,sVar6,0);
                }
              }
            }
          }
          if (bVar1) {
            do {
              ServerOperation::getStatus_abi_cxx11_((ServerOperation *)local_518);
              iVar3 = local_7c;
              pvVar9 = (void *)std::__cxx11::string::c_str();
              sVar6 = std::__cxx11::string::length();
              send(iVar3,pvVar9,sVar6,0);
              sVar7 = recv(local_7c,&size,0x3ff,0);
              if (sVar7 < 1) {
                if (sVar7 == 0) {
                  printf("Client closed remote socket\n");
                  local_51c = 6;
                }
                else {
                  perror("recv error");
                  argv_local._4_4_ = 1;
                  local_51c = 1;
                }
              }
              else {
                buffer[sVar7 + -8] = '\0';
                printf("Message received: %s\n",&size);
                local_51c = 0;
              }
              std::__cxx11::string::~string((string *)local_518);
              pSVar8 = local_40;
              if (local_51c != 0) {
                if (local_51c != 6) goto LAB_001042ec;
                break;
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_540,(char *)&size,(allocator *)(local_568 + 0x27));
              uVar4 = (**(pSVar8->super_ServerOperation)._vptr_ServerOperation)(pSVar8,local_540);
              std::__cxx11::string::~string(local_540);
              std::allocator<char>::~allocator((allocator<char> *)(local_568 + 0x27));
            } while ((uVar4 & 1) != 0);
            ServerOperation::getStatus_abi_cxx11_((ServerOperation *)local_568);
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_568,(char *)((long)&command + 5));
            std::__cxx11::string::~string((string *)local_568);
            if (bVar1) {
              (*(local_40->super_ServerOperation)._vptr_ServerOperation[1])(local_5a8 + 0x20);
              std::__cxx11::string::operator=((string *)(message + 8),(string *)(local_5a8 + 0x20));
              std::__cxx11::string::~string((string *)(local_5a8 + 0x20));
              iVar3 = local_7c;
              ServerOperation::getStatus_abi_cxx11_((ServerOperation *)local_5a8);
              pvVar9 = (void *)std::__cxx11::string::c_str();
              ServerOperation::getStatus_abi_cxx11_((ServerOperation *)local_5c8);
              sVar6 = std::__cxx11::string::length();
              send(iVar3,pvVar9,sVar6,0);
              std::__cxx11::string::~string((string *)local_5c8);
              std::__cxx11::string::~string((string *)local_5a8);
            }
            else {
              ServerOperation::getStatus_abi_cxx11_((ServerOperation *)(message_2 + 8));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stack0xfffffffffffffa18,message_2 + 8);
              std::__cxx11::string::operator=
                        ((string *)(message + 8),(string *)&stack0xfffffffffffffa18);
              std::__cxx11::string::~string((string *)&stack0xfffffffffffffa18);
              std::__cxx11::string::~string((string *)(message_2 + 8));
              send(local_7c,(void *)((long)&PORT + 1),4,0);
            }
            iVar3 = local_7c;
            local_638._32_8_ = 0x6c6f686563616c70;
            builtin_strncpy(message_2,"der",4);
            sVar6 = strlen(local_638 + 0x20);
            recv(iVar3,local_638 + 0x20,sVar6,0);
            iVar3 = local_7c;
            pvVar9 = (void *)std::__cxx11::string::c_str();
            sVar6 = std::__cxx11::string::length();
            send(iVar3,pvVar9,sVar6,0);
            ServerOperation::getStatus_abi_cxx11_((ServerOperation *)local_638);
            poVar10 = std::operator<<((ostream *)&std::cout,(string *)local_638);
            std::operator<<(poVar10,"\n");
            std::__cxx11::string::~string((string *)local_638);
            std::operator<<((ostream *)&std::cout,(string *)(message + 8));
          }
          iVar3 = strncmp((char *)&size,"quit",4);
        } while (iVar3 != 0);
        close(local_7c);
        local_51c = 0;
LAB_001042ec:
        std::__cxx11::string::~string((string *)(message + 8));
      } while (local_51c == 0);
    }
    else {
      perror("bind error");
      argv_local._4_4_ = 1;
    }
  }
  else {
    std::operator<<((ostream *)&std::cout,
                    "No Port or Path to Mailpool directory specified.\nUsage: myserver <port number> <path>\n"
                   );
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv) {
    //ToDo: Put this in Config file
    const char *MESSAGEDIR;
    const char USERDIR[6] = "users";
    const char SUCCESS[4] = "OK\n";
    const char FAILURE[5] = "ERR\n";
    const char EXECUTEPENDING[4] = "EP\n";
    int PORT;

    ServerOperation *command; //command the server executes

    //parse arguments
    if (argc == 3) {
        PORT = atoi(argv[1]);
        MESSAGEDIR = argv[2];
    } else {
        cout << "No Port or Path to Mailpool directory specified.\nUsage: myserver <port number> <path>\n";
        return EXIT_FAILURE;
    }

    //create needed directories
    createWorkingDirectories(MESSAGEDIR, USERDIR);

    //create socket
    int create_socket, new_socket;
    socklen_t addrlen;
    char buffer[BUF];
    long size;
    struct sockaddr_in address, cliaddress;

    create_socket = socket(AF_INET, SOCK_STREAM, 0);

    memset(&address, 0, sizeof(address));
    address.sin_family = AF_INET;
    address.sin_addr.s_addr = INADDR_ANY;
    address.sin_port = htons(PORT);

    if (bind(create_socket, (struct sockaddr *) &address, sizeof(address)) != 0) {
        perror("bind error");
        return EXIT_FAILURE;
    }
    listen(create_socket, 5);

    addrlen = sizeof(struct sockaddr_in);

    //start server loop:
    while (true) {
        printf("Waiting for connections...\n");
        new_socket = accept(create_socket, (struct sockaddr *) &cliaddress, &addrlen);
        if (new_socket > 0) {
            printf("Client connected from %s:%d...\n", inet_ntoa(cliaddress.sin_addr), ntohs(cliaddress.sin_port));
            strcpy(buffer, "Welcome to myserver, Please enter your command:\n");
            send(new_socket, buffer, strlen(buffer), 0);
        }
        //Client connected, start command execution loop:
        bool commandMatched = false;
        string commandResult = "";
        do {
            //get command
            size = recv(new_socket, buffer, BUF - 1, 0);
            if (size > 0) {
                buffer[size] = '\0';
                printf("Message received: %s", buffer);

                commandMatched = true; //we expect a real command, so reset it to true every command call

                //create the received command depending on string that was sent
                if (strncasecmp(buffer, "send", 4) == 0) {
                    command = new SendMessage(MESSAGEDIR);
                } else if (strncasecmp(buffer, "list", 4) == 0) {
                    command = new ListMessage(MESSAGEDIR);
                } else if (strncasecmp(buffer, "read", 4) == 0) {
                    command = new ReadMessage(MESSAGEDIR);
                } else if (strncasecmp(buffer, "del", 3) == 0) {
                    command = new DeleteMessage(MESSAGEDIR);
                } else if (strncasecmp(buffer, "quit", 4) == 0) {
                    //quit
                    //ToDo: make quit a real command :D
                    char message[] = "placeholder";
                    send(new_socket, SUCCESS, strlen(SUCCESS), 0);
                    recv(new_socket, message, strlen(message) - 1, 0); //always wait for confirmation
                    commandResult = "quit\n";
                    send(new_socket, commandResult.c_str(), commandResult.length(), 0);
                    break; //quit command loop -> new client can connect now
                } else {
                    //No commands matched
                    char message[] = "placeholder";
                    send(new_socket, FAILURE, strlen(FAILURE), 0);
                    recv(new_socket, message, strlen(message) - 1, 0); //always wait for confirmation
                    commandMatched = false;
                    commandResult = "No matching command found.\n";
                    send(new_socket, commandResult.c_str(), commandResult.length(), 0);
                }

                //if command was matched - get all the parameters and execute
                if (commandMatched) {
                    //get the parameters
                    do {
                        //always send the client confirmation and the instructions what to do
                        string confirmation = command->getStatus();
                        send(new_socket, confirmation.c_str(), confirmation.length(), 0);

                        //receive next line
                        size = recv(new_socket, buffer, BUF - 1, 0);
                        if (size > 0) {
                            buffer[size] = '\0';
                            printf("Message received: %s\n", buffer);
                        } else if (size == 0) {
                            printf("Client closed remote socket\n");
                            break;
                        } else {
                            perror("recv error");
                            return EXIT_FAILURE;
                        }


                    } while (command->fillMe(buffer)); //Fill Command with parameters till its satisfied

                    //were parameters filled correctly? if yes execute, if not return error message
                    if (command->getStatus() == EXECUTEPENDING) {
                        commandResult = command->execute(); //finally execute command

                        //send the status to the client:
                        send(new_socket, command->getStatus().c_str(), command->getStatus().length(),
                             0); //send command status
                    } else {
                        commandResult = command->getStatus() + "\n"; //save the status as command result

                        //send Error to the client:
                        send(new_socket, FAILURE, strlen(FAILURE), 0); //send command status
                    }
                    char message[] = "placeholder";
                    recv(new_socket, message, strlen(message), 0); //always wait for confirmation
                    send(new_socket, commandResult.c_str(), commandResult.length(), 0); //send command result

                    cout << command->getStatus() << "\n"; //ToDo: remove this line later
                    cout << commandResult; //ToDo: remove this line later
                }

            } else if (size == 0) {
                printf("Client closed remote socket\n");
                break;
            } else {
                perror("recv error");
                return EXIT_FAILURE;
            }
        } while (strncmp(buffer, "quit", 4) != 0);
        close(new_socket);
    }
    close(create_socket);
    return EXIT_SUCCESS;
}